

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::TagAliasRegistry::expandAliases
          (string *__return_storage_ptr__,TagAliasRegistry *this,string *unexpandedTestSpec)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  _Base_ptr p_Var5;
  ulong *puVar6;
  ulong uVar7;
  _Rb_tree_header *p_Var8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  pcVar1 = (unexpandedTestSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + unexpandedTestSpec->_M_string_length);
  p_Var5 = (this->m_registry)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->m_registry)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var8) {
    do {
      lVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,*(ulong *)(p_Var5 + 1),0);
      if (lVar2 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_50,*(ulong *)(p_Var5 + 2));
        puVar6 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar6) {
          local_a8 = *puVar6;
          lStack_a0 = plVar3[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar6;
          local_b8 = (ulong *)*plVar3;
        }
        local_b0 = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::substr((ulong)&local_90,(ulong)__return_storage_ptr__);
        uVar7 = 0xf;
        if (local_b8 != &local_a8) {
          uVar7 = local_a8;
        }
        if (uVar7 < (ulong)(local_88 + local_b0)) {
          uVar7 = 0xf;
          if (local_90 != local_80) {
            uVar7 = local_80[0];
          }
          if (uVar7 < (ulong)(local_88 + local_b0)) goto LAB_001285ff;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b8);
        }
        else {
LAB_001285ff:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90);
        }
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_60 = *plVar3;
          uStack_58 = puVar4[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar3;
          local_70 = (long *)*puVar4;
        }
        local_68 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)plVar3 = 0;
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TagAliasRegistry::expandAliases( std::string const& unexpandedTestSpec ) const {
        std::string expandedTestSpec = unexpandedTestSpec;
        for( auto const& registryKvp : m_registry ) {
            std::size_t pos = expandedTestSpec.find( registryKvp.first );
            if( pos != std::string::npos ) {
                expandedTestSpec =  expandedTestSpec.substr( 0, pos ) +
                                    registryKvp.second.tag +
                                    expandedTestSpec.substr( pos + registryKvp.first.size() );
            }
        }
        return expandedTestSpec;
    }